

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void ggml_backend_tensor_get_async
               (ggml_backend_t backend,ggml_tensor *tensor,void *data,size_t offset,size_t size)

{
  _func_void_ggml_backend_t_ggml_tensor_ptr_void_ptr_size_t_size_t *UNRECOVERED_JUMPTABLE;
  size_t sVar1;
  char *pcVar2;
  int line;
  
  if (tensor->data == (void *)0x0) {
    pcVar2 = "tensor->data != NULL && \"tensor not allocated\"";
    line = 0xf6;
  }
  else {
    sVar1 = ggml_nbytes(tensor);
    if (size + offset <= sVar1) {
      UNRECOVERED_JUMPTABLE = (backend->iface).get_tensor_async;
      if (UNRECOVERED_JUMPTABLE !=
          (_func_void_ggml_backend_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)0x0) {
        (*UNRECOVERED_JUMPTABLE)(backend,tensor,data,offset,size);
        return;
      }
      ggml_backend_tensor_get(tensor,data,offset,size);
      return;
    }
    pcVar2 = "offset + size <= ggml_nbytes(tensor) && \"tensor read out of bounds\"";
    line = 0xf7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

void ggml_backend_tensor_get_async(ggml_backend_t backend, const struct ggml_tensor * tensor, void * data, size_t offset, size_t size) {
    GGML_ASSERT(tensor->data != NULL && "tensor not allocated");
    GGML_ASSERT(offset + size <= ggml_nbytes(tensor) && "tensor read out of bounds");

    if (backend->iface.get_tensor_async == NULL) {
        ggml_backend_tensor_get(tensor, data, offset, size);
    } else {
        backend->iface.get_tensor_async(backend, tensor, data, offset, size);
    }
}